

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
* __thiscall
S2Polygon::OperationWithPolyline
          (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
           *__return_storage_ptr__,S2Polygon *this,OpType op_type,SnapFunction *snap_function,
          S2Polyline *a)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  S2LogMessage local_1a0;
  undefined1 local_190 [8];
  S2Error error;
  unique_ptr<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>_> local_160;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_158;
  undefined1 local_150 [8];
  MutableS2ShapeIndex a_index;
  unique_ptr<s2builderutil::S2PolylineVectorLayer,_std::default_delete<s2builderutil::S2PolylineVectorLayer>_>
  local_f0;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_e8;
  undefined1 local_e0 [8];
  S2BooleanOperation op;
  Options layer_options;
  undefined1 local_58 [8];
  Options options;
  S2Polyline *a_local;
  SnapFunction *snap_function_local;
  OpType op_type_local;
  S2Polygon *this_local;
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  *result;
  
  options.source_id_lexicon_ =
       (ValueLexicon<S2BooleanOperation::SourceId,_std::hash<S2BooleanOperation::SourceId>,_std::equal_to<S2BooleanOperation::SourceId>_>
        *)a;
  S2BooleanOperation::Options::Options((Options *)local_58);
  S2BooleanOperation::Options::set_snap_function((Options *)local_58,snap_function);
  std::
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  ::vector(__return_storage_ptr__);
  s2builderutil::S2PolylineVectorLayer::Options::Options((Options *)((long)&op.result_empty_ + 4));
  s2builderutil::S2PolylineVectorLayer::Options::set_polyline_type
            ((Options *)((long)&op.result_empty_ + 4),WALK);
  a_index.update_state_._M_t.
  super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl =
       (__uniq_ptr_data<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>,_true,_true>
        )(__uniq_ptr_data<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>,_true,_true>
          )__return_storage_ptr__;
  absl::
  make_unique<s2builderutil::S2PolylineVectorLayer,std::vector<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>,std::allocator<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>>>*,s2builderutil::S2PolylineVectorLayer::Options&>
            ((absl *)&local_f0,
             (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
              **)&a_index.update_state_,(Options *)((long)&op.result_empty_ + 4));
  std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
  unique_ptr<s2builderutil::S2PolylineVectorLayer,std::default_delete<s2builderutil::S2PolylineVectorLayer>,void>
            ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)&local_e8,
             &local_f0);
  S2BooleanOperation::S2BooleanOperation
            ((S2BooleanOperation *)local_e0,op_type,&local_e8,(Options *)local_58);
  std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr(&local_e8);
  std::
  unique_ptr<s2builderutil::S2PolylineVectorLayer,_std::default_delete<s2builderutil::S2PolylineVectorLayer>_>
  ::~unique_ptr(&local_f0);
  MutableS2ShapeIndex::MutableS2ShapeIndex((MutableS2ShapeIndex *)local_150);
  error._32_8_ = options.source_id_lexicon_;
  absl::make_unique<S2Polyline::Shape,S2Polyline_const*>
            ((absl *)&local_160,(S2Polyline **)&error.field_0x20);
  std::unique_ptr<S2Shape,std::default_delete<S2Shape>>::
  unique_ptr<S2Polyline::Shape,std::default_delete<S2Polyline::Shape>,void>
            ((unique_ptr<S2Shape,std::default_delete<S2Shape>> *)&local_158,&local_160);
  MutableS2ShapeIndex::Add((MutableS2ShapeIndex *)local_150,&local_158);
  std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(&local_158);
  std::unique_ptr<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>_>::~unique_ptr
            (&local_160);
  S2Error::S2Error((S2Error *)local_190);
  bVar1 = S2BooleanOperation::Build
                    ((S2BooleanOperation *)local_e0,(S2ShapeIndex *)local_150,
                     &(this->index_).super_S2ShapeIndex,(S2Error *)local_190);
  if (bVar1) {
    S2Error::~S2Error((S2Error *)local_190);
    MutableS2ShapeIndex::~MutableS2ShapeIndex((MutableS2ShapeIndex *)local_150);
    S2BooleanOperation::~S2BooleanOperation((S2BooleanOperation *)local_e0);
    S2BooleanOperation::Options::~Options((Options *)local_58);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x49f,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_1a0);
  poVar2 = std::operator<<(poVar2,"Polyline ");
  pcVar3 = S2BooleanOperation::OpTypeToString(op_type);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," operation failed: ");
  ::operator<<(poVar2,(S2Error *)local_190);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_1a0);
}

Assistant:

vector<unique_ptr<S2Polyline>> S2Polygon::OperationWithPolyline(
    S2BooleanOperation::OpType op_type,
    const S2Builder::SnapFunction& snap_function,
    const S2Polyline& a) const {
  S2BooleanOperation::Options options;
  options.set_snap_function(snap_function);
  vector<unique_ptr<S2Polyline>> result;
  S2PolylineVectorLayer::Options layer_options;
  layer_options.set_polyline_type(
      S2PolylineVectorLayer::Options::PolylineType::WALK);
  S2BooleanOperation op(
      op_type, make_unique<S2PolylineVectorLayer>(&result, layer_options),
      options);
  MutableS2ShapeIndex a_index;
  a_index.Add(make_unique<S2Polyline::Shape>(&a));
  S2Error error;
  if (!op.Build(a_index, index_, &error)) {
    S2_LOG(DFATAL) << "Polyline " << S2BooleanOperation::OpTypeToString(op_type)
                << " operation failed: " << error;
  }
  return result;
}